

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getInjectionUnits_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  uchar uVar1;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *p_Var2;
  FederateState *this_00;
  InputInfo *pIVar3;
  string *psVar4;
  BaseType in_ESI;
  CommonCore *in_RDI;
  InputInfo *inpInfo;
  FederateState *fed;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *handleInfo;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffd8;
  InterfaceHandle handle_00;
  LocalFederateId federateID;
  undefined1 *local_8;
  
  federateID.fid = in_ESI;
  p_Var2 = getHandleInfo((CommonCore *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                         ,(InterfaceHandle)(BaseType)((ulong)in_RDI >> 0x20));
  if (p_Var2 != (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                 *)0x0) {
    uVar1 = (p_Var2->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>
            ._M_storage._M_storage.__data[4];
    if (uVar1 != 'i') {
      if (uVar1 != 'p') {
        local_8 = gEmptyString_abi_cxx11_;
        return (string *)local_8;
      }
      return (string *)
             ((long)&p_Var2[1].
                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                     .
                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>
                     ._M_storage._M_storage + 0x10);
    }
    this_00 = getFederateAt(in_RDI,federateID);
    handle_00.hid = (BaseType)((ulong)p_Var2 >> 0x20);
    FederateState::interfaces(this_00);
    pIVar3 = InterfaceInfo::getInput
                       ((InterfaceInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),handle_00);
    if (pIVar3 != (InputInfo *)0x0) {
      psVar4 = InputInfo::getInjectionUnits_abi_cxx11_((InputInfo *)this);
      return psVar4;
    }
  }
  local_8 = gEmptyString_abi_cxx11_;
  return (string *)local_8;
}

Assistant:

const std::string& CommonCore::getInjectionUnits(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getInjectionUnits();
                }
                break;
            }
            case InterfaceType::PUBLICATION:
                return handleInfo->units;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}